

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_file_types.cpp
# Opt level: O0

char * crnlib::texture_file_types::get_extension(format fmt)

{
  format fmt_local;
  char *local_8;
  
  if (fmt < cNumFileFormats) {
    local_8 = get_extension::extensions[fmt];
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char* texture_file_types::get_extension(format fmt) {
  CRNLIB_ASSERT(fmt < cNumFileFormats);
  if (fmt >= cNumFileFormats)
    return NULL;

  static const char* extensions[cNumFileFormats] =
      {
          "dds",
          "crn",
          "ktx",

          "tga",
          "png",
          "jpg",
          "jpeg",
          "bmp",
          "gif",
          "tif",
          "tiff",
          "ppm",
          "pgm",
          "psd",
          "jp2",

          "<clipboard>",
          "<dragdrop>"};
  return extensions[fmt];
}